

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

string * __thiscall toml::detail::literal::name_abi_cxx11_(literal *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  allocator<char> local_51 [81];
  
  __s = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
             (allocator<char> *)in_stack_ffffffffffffff70);
  this_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&in_RSI->field_2;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffff77;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RSI,(char *)__s,(size_type)in_RDI,(allocator<char> *)__lhs);
  std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::operator+(__lhs,(char *)this_00);
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator(local_51);
  return __s;
}

Assistant:

TOML11_INLINE std::string literal::name() const
{
    return std::string("literal{") + std::string(value_, size_) + "}";
}